

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::tessellation::anon_unknown_1::UserDefinedIOTestInstance::iterate
          (TestStatus *__return_storage_ptr__,UserDefinedIOTestInstance *this)

{
  ostringstream *poVar1;
  VkDeviceSize bufferSize;
  void **ppvVar2;
  uint uVar3;
  IOType IVar4;
  ProgramCollection<vk::ProgramBinary> *pPVar5;
  TestLog *log;
  pointer pSVar6;
  TopLevelObject *pTVar7;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  Allocation *pAVar8;
  bool bVar9;
  deUint32 queueFamilyIndex;
  int iVar10;
  deUint32 stride;
  int iVar11;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue queue;
  Allocator *pAVar12;
  TextureFormat TVar13;
  DescriptorSetLayoutBuilder *this_00;
  DescriptorPoolBuilder *this_01;
  DescriptorSetUpdateBuilder *this_02;
  GraphicsPipelineBuilder *pGVar14;
  ProgramBinary *pPVar15;
  ulong uVar16;
  MessageBuilder *this_03;
  int iVar17;
  uint uVar18;
  TestStatus *pTVar19;
  long lVar20;
  uint *puVar21;
  uint *value;
  int result;
  int i;
  long lVar22;
  VkImageSubresourceLayers subresourceLayers;
  VkExtent3D extent;
  IVec2 renderSize;
  allocator<char> local_524;
  allocator<char> local_523;
  allocator<char> local_522;
  allocator<char> local_521;
  VkDeviceSize local_520;
  TestStatus *local_518;
  Allocator *local_510;
  RefBase<vk::VkCommandBuffer_s_*> local_508;
  ConstPixelBufferAccess resultImageAccess;
  RefBase<vk::Handle<(vk::HandleType)17>_> local_498;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined4 local_468;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined4 local_448;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined4 local_428;
  VkImageMemoryBarrier colorAttachmentLayoutBarrier;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_298;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_278;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_258;
  ConstPixelBufferAccess local_238;
  VkDescriptorBufferInfo resultBufferInfo;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_1f8;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_1d8;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_1b8;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_198;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_178;
  Image colorAttachmentImage;
  string local_120;
  string local_100;
  string local_e0;
  Buffer colorBuffer;
  Buffer resultBuffer;
  Buffer vertexBuffer;
  
  local_518 = __return_storage_ptr__;
  vki = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  requireFeatures(vki,physDevice,9);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  queue = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  pAVar12 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  iVar10 = referenceVertexCount
                     ((this->m_caseDef).primitiveType,SPACINGMODE_EQUAL,false,iterate::attributes,
                      iterate::attributes + 2);
  local_520 = CONCAT44(local_520._4_4_,iVar10);
  iVar10 = referenceVertexCount
                     ((this->m_caseDef).primitiveType,SPACINGMODE_EQUAL,true,iterate::attributes,
                      iterate::attributes + 2);
  TVar13 = ::vk::mapVkFormat(VK_FORMAT_R32_SFLOAT);
  stride = tcu::getPixelSize(TVar13);
  uVar16 = (ulong)(stride * 10);
  makeBufferCreateInfo((VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,uVar16,0x80);
  local_510 = pAVar12;
  tessellation::Buffer::Buffer
            (&vertexBuffer,vk,device,pAVar12,(VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,
             (MemoryRequirement)0x1);
  memcpy((vertexBuffer.m_allocation.
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
         m_hostPtr,iterate::attributes,uVar16);
  ::vk::flushMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((vertexBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (vertexBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,uVar16);
  bufferSize = (long)(int)local_520 * 4 + 4;
  makeBufferCreateInfo((VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,bufferSize,0x20);
  pAVar12 = local_510;
  tessellation::Buffer::Buffer
            (&resultBuffer,vk,device,local_510,(VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,
             (MemoryRequirement)0x1);
  pAVar8 = resultBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  memset((resultBuffer.m_allocation.
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
         m_hostPtr,0,bufferSize);
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar8->m_memory).m_internal,pAVar8->m_offset,bufferSize);
  renderSize.m_data[0] = 0x100;
  renderSize.m_data[1] = 0x100;
  makeImageCreateInfo((VkImageCreateInfo *)&colorAttachmentLayoutBarrier,&renderSize,
                      VK_FORMAT_R8G8B8A8_UNORM,0x11,1);
  Image::Image(&colorAttachmentImage,vk,device,pAVar12,
               (VkImageCreateInfo *)&colorAttachmentLayoutBarrier,(MemoryRequirement)0x0);
  iVar17 = renderSize.m_data[1] * renderSize.m_data[0];
  TVar13 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar11 = tcu::getPixelSize(TVar13);
  local_520 = (VkDeviceSize)(iVar17 * iVar11);
  makeBufferCreateInfo((VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,local_520,2);
  tessellation::Buffer::Buffer
            (&colorBuffer,vk,device,pAVar12,(VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,
             (MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&colorAttachmentLayoutBarrier);
  this_00 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)&colorAttachmentLayoutBarrier,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,4);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&resultImageAccess,this_00,vk,device,0);
  local_258.m_data.deleter.m_device = (VkDevice)resultImageAccess._16_8_;
  local_258.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)resultImageAccess.m_pitch.m_data._4_8_;
  local_258.m_data.object.m_internal._0_4_ = resultImageAccess.m_format.order;
  local_258.m_data.object.m_internal._4_4_ = resultImageAccess.m_format.type;
  local_258.m_data.deleter.m_deviceIface = (DeviceInterface *)resultImageAccess.m_size.m_data._0_8_;
  resultImageAccess.m_format.order = R;
  resultImageAccess.m_format.type = SNORM_INT8;
  resultImageAccess.m_size.m_data[0] = 0;
  resultImageAccess.m_size.m_data[1] = 0;
  resultImageAccess.m_size.m_data[2] = 0;
  resultImageAccess.m_pitch.m_data[0] = 0;
  resultImageAccess.m_pitch.m_data[1] = 0;
  resultImageAccess.m_pitch.m_data[2] = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&resultImageAccess);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&colorAttachmentLayoutBarrier);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&resultImageAccess);
  this_01 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&resultImageAccess,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER
                       ,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&colorAttachmentLayoutBarrier,this_01,vk,
             device,1,1);
  local_178.m_data.deleter.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  local_178.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_178.m_data.object.m_internal = colorAttachmentLayoutBarrier._0_8_;
  local_178.m_data.deleter.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)0x0;
  colorAttachmentLayoutBarrier.srcAccessMask = 0;
  colorAttachmentLayoutBarrier.dstAccessMask = 0;
  colorAttachmentLayoutBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentLayoutBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&colorAttachmentLayoutBarrier);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&resultImageAccess);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&colorAttachmentLayoutBarrier,vk,device
                    ,(VkDescriptorPool)local_178.m_data.object.m_internal,
                    (VkDescriptorSetLayout)local_258.m_data.object.m_internal);
  local_278.m_data.deleter.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  local_278.m_data.deleter.m_pool.m_internal._0_4_ = colorAttachmentLayoutBarrier.oldLayout;
  local_278.m_data.deleter.m_pool.m_internal._4_4_ = colorAttachmentLayoutBarrier.newLayout;
  local_278.m_data.object.m_internal = colorAttachmentLayoutBarrier._0_8_;
  local_278.m_data.deleter.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)0x0;
  colorAttachmentLayoutBarrier.srcAccessMask = 0;
  colorAttachmentLayoutBarrier.dstAccessMask = 0;
  colorAttachmentLayoutBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentLayoutBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&colorAttachmentLayoutBarrier);
  resultBufferInfo.buffer.m_internal =
       resultBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = bufferSize;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&colorAttachmentLayoutBarrier);
  resultImageAccess.m_format.order = R;
  resultImageAccess.m_format.type = SNORM_INT8;
  this_02 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      ((DescriptorSetUpdateBuilder *)&colorAttachmentLayoutBarrier,
                       (VkDescriptorSet)local_278.m_data.object.m_internal,
                       (Location *)&resultImageAccess,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       &resultBufferInfo);
  ::vk::DescriptorSetUpdateBuilder::update(this_02,vk,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&colorAttachmentLayoutBarrier);
  local_438 = 1;
  uStack_430 = 1;
  local_428 = 1;
  subresourceRange.levelCount = 1;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.layerCount = 1;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&colorAttachmentLayoutBarrier,vk,device,
                (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                         m_data.object.m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R8G8B8A8_UNORM,
                subresourceRange);
  local_198.m_data.deleter.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  local_198.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_198.m_data.object.m_internal = colorAttachmentLayoutBarrier._0_8_;
  local_198.m_data.deleter.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)0x0;
  colorAttachmentLayoutBarrier.srcAccessMask = 0;
  colorAttachmentLayoutBarrier.dstAccessMask = 0;
  colorAttachmentLayoutBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentLayoutBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&colorAttachmentLayoutBarrier);
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)&colorAttachmentLayoutBarrier,vk,device,
                 VK_FORMAT_R8G8B8A8_UNORM);
  local_498.m_data.deleter.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  local_498.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_498.m_data.object.m_internal = colorAttachmentLayoutBarrier._0_8_;
  local_498.m_data.deleter.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)0x0;
  colorAttachmentLayoutBarrier.srcAccessMask = 0;
  colorAttachmentLayoutBarrier.dstAccessMask = 0;
  colorAttachmentLayoutBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentLayoutBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)17>_> *)&colorAttachmentLayoutBarrier);
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&colorAttachmentLayoutBarrier,vk,device,
                  (VkRenderPass)local_498.m_data.object.m_internal,
                  (VkImageView)local_198.m_data.object.m_internal,renderSize.m_data[0],
                  renderSize.m_data[1],1);
  local_1b8.m_data.deleter.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  local_1b8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_1b8.m_data.object.m_internal = colorAttachmentLayoutBarrier._0_8_;
  local_1b8.m_data.deleter.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)0x0;
  colorAttachmentLayoutBarrier.srcAccessMask = 0;
  colorAttachmentLayoutBarrier.dstAccessMask = 0;
  colorAttachmentLayoutBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentLayoutBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&colorAttachmentLayoutBarrier);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&colorAttachmentLayoutBarrier,vk,
                     device,(VkDescriptorSetLayout)local_258.m_data.object.m_internal);
  local_298.m_data.deleter.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  local_298.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_298.m_data.object.m_internal = colorAttachmentLayoutBarrier._0_8_;
  local_298.m_data.deleter.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)0x0;
  colorAttachmentLayoutBarrier.srcAccessMask = 0;
  colorAttachmentLayoutBarrier.dstAccessMask = 0;
  colorAttachmentLayoutBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentLayoutBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&colorAttachmentLayoutBarrier);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&colorAttachmentLayoutBarrier,vk,device,
                  queueFamilyIndex);
  local_1d8.m_data.deleter.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  local_1d8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_1d8.m_data.object.m_internal = colorAttachmentLayoutBarrier._0_8_;
  local_1d8.m_data.deleter.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)0x0;
  colorAttachmentLayoutBarrier.srcAccessMask = 0;
  colorAttachmentLayoutBarrier.dstAccessMask = 0;
  colorAttachmentLayoutBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentLayoutBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&colorAttachmentLayoutBarrier);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&colorAttachmentLayoutBarrier,vk,device,
             (VkCommandPool)local_1d8.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_508.m_data.deleter.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  local_508.m_data.deleter.m_pool.m_internal._0_4_ = colorAttachmentLayoutBarrier.oldLayout;
  local_508.m_data.deleter.m_pool.m_internal._4_4_ = colorAttachmentLayoutBarrier.newLayout;
  local_508.m_data.object = (VkCommandBuffer_s *)colorAttachmentLayoutBarrier._0_8_;
  local_508.m_data.deleter.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)0x0;
  colorAttachmentLayoutBarrier.srcAccessMask = 0;
  colorAttachmentLayoutBarrier.dstAccessMask = 0;
  colorAttachmentLayoutBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentLayoutBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&colorAttachmentLayoutBarrier);
  memset(&colorAttachmentLayoutBarrier.pNext,0,0xf4);
  colorAttachmentLayoutBarrier.sType = renderSize.m_data[0];
  colorAttachmentLayoutBarrier._4_4_ = renderSize.m_data[1];
  pGVar14 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                      ((GraphicsPipelineBuilder *)&colorAttachmentLayoutBarrier,VK_FORMAT_R32_SFLOAT
                       ,stride);
  pPVar5 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"vert",&local_521);
  pPVar15 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar5,(string *)&local_238);
  pGVar14 = GraphicsPipelineBuilder::setShader
                      (pGVar14,vk,device,VK_SHADER_STAGE_VERTEX_BIT,pPVar15,
                       (VkSpecializationInfo *)0x0);
  pPVar5 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"tesc",&local_522);
  pPVar15 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar5,&local_e0);
  pGVar14 = GraphicsPipelineBuilder::setShader
                      (pGVar14,vk,device,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,pPVar15,
                       (VkSpecializationInfo *)0x0);
  pPVar5 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"tese",&local_523);
  pPVar15 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar5,&local_100);
  pGVar14 = GraphicsPipelineBuilder::setShader
                      (pGVar14,vk,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,pPVar15,
                       (VkSpecializationInfo *)0x0);
  pPVar5 = ((this->super_TestInstance).m_context)->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"frag",&local_524);
  pPVar15 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar5,&local_120);
  pGVar14 = GraphicsPipelineBuilder::setShader
                      (pGVar14,vk,device,VK_SHADER_STAGE_FRAGMENT_BIT,pPVar15,
                       (VkSpecializationInfo *)0x0);
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&resultImageAccess,pGVar14,vk,device,
             (VkPipelineLayout)local_298.m_data.object.m_internal,
             (VkRenderPass)local_498.m_data.object.m_internal);
  local_1f8.m_data.deleter.m_device = (VkDevice)resultImageAccess._16_8_;
  local_1f8.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)resultImageAccess.m_pitch.m_data._4_8_;
  local_1f8.m_data.object.m_internal._0_4_ = resultImageAccess.m_format.order;
  local_1f8.m_data.object.m_internal._4_4_ = resultImageAccess.m_format.type;
  local_1f8.m_data.deleter.m_deviceIface = (DeviceInterface *)resultImageAccess.m_size.m_data._0_8_;
  resultImageAccess.m_format.order = R;
  resultImageAccess.m_format.type = SNORM_INT8;
  resultImageAccess.m_size.m_data[0] = 0;
  resultImageAccess.m_size.m_data[1] = 0;
  resultImageAccess.m_size.m_data[2] = 0;
  resultImageAccess.m_pitch.m_data[0] = 0;
  resultImageAccess.m_pitch.m_data[1] = 0;
  resultImageAccess.m_pitch.m_data[2] = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&resultImageAccess);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_238);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder
            ((GraphicsPipelineBuilder *)&colorAttachmentLayoutBarrier);
  beginCommandBuffer(vk,local_508.m_data.object);
  local_458 = 1;
  uStack_450 = 1;
  local_448 = 1;
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.layerCount = 1;
  makeImageMemoryBarrier
            (&colorAttachmentLayoutBarrier,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                      m_data.object.m_internal,subresourceRange_00);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_508.m_data.object,1,0x80,0,0,0,0,0,1,&colorAttachmentLayoutBarrier);
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)renderSize.m_data;
  resultImageAccess.m_format.order = R;
  resultImageAccess.m_format.type = SNORM_INT8;
  resultImageAccess.m_size.m_data[0] = 0;
  resultImageAccess.m_size.m_data[1] = 0x3f800000;
  beginRenderPass(vk,local_508.m_data.object,(VkRenderPass)local_498.m_data.object.m_internal,
                  (VkFramebuffer)local_1b8.m_data.object.m_internal,
                  (VkRect2D *)&colorAttachmentLayoutBarrier,(Vec4 *)&resultImageAccess);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,local_508.m_data.object,0,local_1f8.m_data.object.m_internal);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,local_508.m_data.object,0,local_298.m_data.object.m_internal,0,1,(int)&local_278,0,0
            );
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  (*vk->_vptr_DeviceInterface[0x58])(vk,local_508.m_data.object,0,1);
  (*vk->_vptr_DeviceInterface[0x59])(vk,local_508.m_data.object,10,1,0,0);
  endRenderPass(vk,local_508.m_data.object);
  local_478 = 1;
  uStack_470 = 1;
  local_468 = 1;
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.layerCount = 1;
  makeImageMemoryBarrier
            (&colorAttachmentLayoutBarrier,0x100,0x800,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                      m_data.object.m_internal,subresourceRange_01);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_508.m_data.object,0x400,0x1000,0,0,0,0,0,1,&colorAttachmentLayoutBarrier);
  subresourceLayers.baseArrayLayer = 0;
  subresourceLayers.layerCount = 1;
  subresourceLayers.aspectMask = 1;
  subresourceLayers.mipLevel = 0;
  extent.depth = 1;
  extent.width = renderSize.m_data[0];
  extent.height = renderSize.m_data[1];
  makeBufferImageCopy((VkBufferImageCopy *)&colorAttachmentLayoutBarrier,extent,subresourceLayers);
  (*vk->_vptr_DeviceInterface[99])
            (vk,local_508.m_data.object,
             colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
             object.m_internal,6,
             colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,1,(int)&colorAttachmentLayoutBarrier);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)&colorAttachmentLayoutBarrier,0x1000,0x2000,
             (VkBuffer)
             colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,local_520);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_508.m_data.object,0x1000,0x4000,0,0,0,1,(int)&colorAttachmentLayoutBarrier,0,0
            );
  endCommandBuffer(vk,local_508.m_data.object);
  submitCommandsAndWait(vk,device,queue,local_508.m_data.object);
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((colorBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (colorBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,local_520);
  tcu::TextureLevel::TextureLevel((TextureLevel *)&colorAttachmentLayoutBarrier);
  tcu::ImageIO::loadPNG
            ((TextureLevel *)&colorAttachmentLayoutBarrier,
             ((this->super_TestInstance).m_context)->m_testCtx->m_curArchive,
             (this->m_caseDef).referenceImagePath._M_dataplus._M_p);
  local_238.m_format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&resultImageAccess,&local_238.m_format,renderSize.m_data[0],renderSize.m_data[1],1,
             (colorBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr);
  log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&local_238,(TextureLevel *)&colorAttachmentLayoutBarrier);
  bVar9 = tcu::fuzzyCompare(log,"ImageComparison","Image Comparison",&local_238,&resultImageAccess,
                            0.02,COMPARE_LOG_RESULT);
  local_520 = CONCAT71(local_520._1_7_,bVar9);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&colorAttachmentLayoutBarrier);
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((resultBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (resultBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  uVar3 = *(resultBuffer.m_allocation.
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
           m_hostPtr;
  if ((int)uVar3 < iVar10) {
    colorAttachmentLayoutBarrier._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    ppvVar2 = &colorAttachmentLayoutBarrier.pNext;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar2);
    std::operator<<((ostream *)ppvVar2,"Failure: got ");
    std::ostream::operator<<(ppvVar2,uVar3);
    std::operator<<((ostream *)ppvVar2," vertices, but expected at least ");
    std::ostream::operator<<(ppvVar2,iVar10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&colorAttachmentLayoutBarrier,
               (EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&colorAttachmentLayoutBarrier,"Wrong number of vertices",
               (allocator<char> *)&resultImageAccess);
    pTVar19 = local_518;
    tcu::TestStatus::fail(local_518,(string *)&colorAttachmentLayoutBarrier);
  }
  else {
    IVar4 = (this->m_caseDef).ioType;
    if ((ulong)IVar4 < 3) {
      uVar18 = *(uint *)(&DAT_009e5c48 + (ulong)IVar4 * 4);
    }
    else {
      uVar18 = (uint)(IVar4 != IO_TYPE_PER_PATCH_BLOCK_ARRAY) * 3 + 2;
    }
    puVar21 = (uint *)((long)(resultBuffer.m_allocation.
                              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                              m_data.ptr)->m_hostPtr + 4);
    local_510 = (Allocator *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
    lVar20 = 0;
    lVar22 = 0;
    iVar10 = 0;
    while( true ) {
      pSVar6 = (this->m_tesInputs).
               super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((int)((ulong)((long)(this->m_tesInputs).
                              super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6) >> 4) <=
          lVar22) break;
      iVar11 = (**(code **)(**(long **)((long)&pSVar6->m_ptr + lVar20) + 0x38))();
      iVar10 = iVar10 + iVar11;
      lVar22 = lVar22 + 1;
      lVar20 = lVar20 + 0x10;
    }
    uVar16 = 0;
    if (0 < (int)uVar3) {
      uVar16 = (ulong)uVar3;
    }
    do {
      value = puVar21;
      bVar9 = uVar16 == 0;
      uVar16 = uVar16 - 1;
      if (bVar9) {
        if ((char)local_520 == '\0') {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&colorAttachmentLayoutBarrier,"Image comparison failed",
                     (allocator<char> *)&resultImageAccess);
          pTVar19 = local_518;
          tcu::TestStatus::fail(local_518,(string *)&colorAttachmentLayoutBarrier);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&colorAttachmentLayoutBarrier,"OK",
                     (allocator<char> *)&resultImageAccess);
          pTVar19 = local_518;
          tcu::TestStatus::pass(local_518,(string *)&colorAttachmentLayoutBarrier);
        }
        goto LAB_00734f56;
      }
      if (iVar10 * uVar18 < *value) {
        ppvVar2 = &colorAttachmentLayoutBarrier.pNext;
        colorAttachmentLayoutBarrier._0_8_ = local_510;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar2);
        std::operator<<((ostream *)ppvVar2,"Failure: out_te_firstFailedInputIndex has value ");
        this_03 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&colorAttachmentLayoutBarrier,value);
        poVar1 = &this_03->m_str;
        std::operator<<((ostream *)poVar1,", but should be in range [0, ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,"]");
        tcu::MessageBuilder::operator<<(this_03,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar2);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&colorAttachmentLayoutBarrier,"Invalid values returned from shader",
                   (allocator<char> *)&resultImageAccess);
        pTVar19 = local_518;
        tcu::TestStatus::fail(local_518,(string *)&colorAttachmentLayoutBarrier);
        goto LAB_00734f56;
      }
      puVar21 = value + 1;
    } while (*value == iVar10 * uVar18);
    ppvVar2 = &colorAttachmentLayoutBarrier.pNext;
    colorAttachmentLayoutBarrier._0_8_ = local_510;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar2);
    std::operator<<((ostream *)ppvVar2,
                    "Failure: in tessellation evaluation shader, check for input ");
    uVar3 = *value;
    iVar11 = 0;
    iVar10 = -1;
    while (iVar17 = iVar10 + 1, iVar11 < (int)uVar3) {
      iVar10 = (*((this->m_tesInputs).
                  super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar17].m_ptr)->_vptr_TopLevelObject[7])
                         ();
      iVar11 = iVar11 + iVar10 * uVar18;
      iVar10 = iVar17;
    }
    if ((int)uVar3 < iVar11) {
      lVar20 = (long)iVar10;
      iVar10 = (*((this->m_tesInputs).
                  super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar20].m_ptr)->_vptr_TopLevelObject[7])
                         ();
      iVar11 = iVar11 - iVar10 * uVar18;
    }
    else {
      lVar20 = (long)iVar17;
    }
    pTVar7 = (this->m_tesInputs).
             super__Vector_base<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>,_std::allocator<de::SharedPtr<vkt::tessellation::(anonymous_namespace)::TopLevelObject>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar20].m_ptr;
    (*pTVar7->_vptr_TopLevelObject[8])
              (&resultImageAccess,pTVar7,(ulong)(uVar3 - iVar11),(ulong)uVar18);
    std::operator<<((ostream *)ppvVar2,(string *)&resultImageAccess);
    std::operator<<((ostream *)ppvVar2," failed");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&colorAttachmentLayoutBarrier,
               (EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&resultImageAccess);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&colorAttachmentLayoutBarrier,
               "Invalid input value in tessellation evaluation shader",
               (allocator<char> *)&resultImageAccess);
    pTVar19 = local_518;
    tcu::TestStatus::fail(local_518,(string *)&colorAttachmentLayoutBarrier);
  }
LAB_00734f56:
  std::__cxx11::string::~string((string *)&colorAttachmentLayoutBarrier);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_1f8);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_508);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_1d8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_298);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_1b8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::~RefBase(&local_498);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_198);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_278);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_178);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_258);
  tessellation::Buffer::~Buffer(&colorBuffer);
  Image::~Image(&colorAttachmentImage);
  tessellation::Buffer::~Buffer(&resultBuffer);
  tessellation::Buffer::~Buffer(&vertexBuffer);
  return pTVar19;
}

Assistant:

tcu::TestStatus UserDefinedIOTestInstance::iterate (void)
{
	requireFeatures(m_context.getInstanceInterface(), m_context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS);

	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	const int				numAttributes				= NUM_TESS_LEVELS + 2 + 2;
	static const float		attributes[numAttributes]	= { /* inner */ 3.0f, 4.0f, /* outer */ 5.0f, 6.0f, 7.0f, 8.0f, /* pos. scale */ 1.2f, 1.3f, /* pos. offset */ -0.3f, -0.4f };
	const int				refNumVertices				= referenceVertexCount(m_caseDef.primitiveType, SPACINGMODE_EQUAL, false, &attributes[0], &attributes[2]);
	const int				refNumUniqueVertices		= referenceVertexCount(m_caseDef.primitiveType, SPACINGMODE_EQUAL, true, &attributes[0], &attributes[2]);

	// Vertex input attributes buffer: to pass tessellation levels

	const VkFormat     vertexFormat				= VK_FORMAT_R32_SFLOAT;
	const deUint32     vertexStride				= tcu::getPixelSize(mapVkFormat(vertexFormat));
	const VkDeviceSize vertexDataSizeBytes		= numAttributes * vertexStride;
	const Buffer       vertexBuffer				(vk, device, allocator, makeBufferCreateInfo(vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible);

	{
		const Allocation& alloc = vertexBuffer.getAllocation();
		deMemcpy(alloc.getHostPtr(), &attributes[0], static_cast<std::size_t>(vertexDataSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), vertexDataSizeBytes);
	}

	// Output buffer: number of invocations and verification indices

	const int		   resultBufferMaxVertices	= refNumVertices;
	const VkDeviceSize resultBufferSizeBytes    = sizeof(deInt32) + resultBufferMaxVertices * sizeof(deUint32);
	const Buffer       resultBuffer             (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	{
		const Allocation& alloc = resultBuffer.getAllocation();
		deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
	}

	// Color attachment

	const tcu::IVec2			  renderSize				 = tcu::IVec2(RENDER_SIZE, RENDER_SIZE);
	const VkFormat				  colorFormat				 = VK_FORMAT_R8G8B8A8_UNORM;
	const VkImageSubresourceRange colorImageSubresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Image					  colorAttachmentImage		 (vk, device, allocator,
															 makeImageCreateInfo(renderSize, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, 1u),
															 MemoryRequirement::Any);

	// Color output buffer: image will be copied here for verification

	const VkDeviceSize	colorBufferSizeBytes	= renderSize.x()*renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer		colorBuffer				(vk, device, allocator, makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet    (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  resultBufferInfo = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	// Pipeline

	const Unique<VkImageView>      colorAttachmentView(makeImageView(vk, device, *colorAttachmentImage, VK_IMAGE_VIEW_TYPE_2D, colorFormat, colorImageSubresourceRange));
	const Unique<VkRenderPass>     renderPass         (makeRenderPass(vk, device, colorFormat));
	const Unique<VkFramebuffer>    framebuffer        (makeFramebuffer(vk, device, *renderPass, *colorAttachmentView, renderSize.x(), renderSize.y(), 1u));
	const Unique<VkPipelineLayout> pipelineLayout     (makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>    cmdPool            (makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>  cmdBuffer          (allocateCommandBuffer (vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setRenderSize                (renderSize)
		.setPatchControlPoints        (numAttributes)
		.setVertexInputSingleAttribute(vertexFormat, vertexStride)
		.setShader                    (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					m_context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	m_context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get("tese"), DE_NULL)
		.setShader                    (vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,				m_context.getBinaryCollection().get("frag"), DE_NULL)
		.build                        (vk, device, *pipelineLayout, *renderPass));

	// Begin draw

	beginCommandBuffer(vk, *cmdBuffer);

	// Change color attachment image layout
	{
		const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
			(VkAccessFlags)0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
	}

	{
		const VkRect2D renderArea = {
			makeOffset2D(0, 0),
			makeExtent2D(renderSize.x(), renderSize.y()),
		};
		const tcu::Vec4 clearColor(0.0f, 0.0f, 0.0f, 1.0f);

		beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
	}

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
	{
		const VkDeviceSize vertexBufferOffset = 0ull;
		vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
	}

	vk.cmdDraw(*cmdBuffer, numAttributes, 1u, 0u, 0u);
	endRenderPass(vk, *cmdBuffer);

	// Copy render result to a host-visible buffer
	{
		const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
	}
	{
		const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(renderSize.x(), renderSize.y(), 1), makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u));
		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &copyRegion);
	}
	{
		const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *colorBuffer, 0ull, colorBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verification

	bool isImageCompareOK = false;
	{
		const Allocation& colorBufferAlloc = colorBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc.getMemory(), colorBufferAlloc.getOffset(), colorBufferSizeBytes);

		// Load reference image
		tcu::TextureLevel referenceImage;
		tcu::ImageIO::loadPNG(referenceImage, m_context.getTestContext().getArchive(), m_caseDef.referenceImagePath.c_str());

		// Verify case result
		const tcu::ConstPixelBufferAccess resultImageAccess(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1, colorBufferAlloc.getHostPtr());
		isImageCompareOK = tcu::fuzzyCompare(m_context.getTestContext().getLog(), "ImageComparison", "Image Comparison",
											 referenceImage.getAccess(), resultImageAccess, 0.02f, tcu::COMPARE_LOG_RESULT);
	}
	{
		const Allocation& resultAlloc = resultBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

		const deInt32			numVertices = *static_cast<deInt32*>(resultAlloc.getHostPtr());
		const deUint32* const	vertices    = reinterpret_cast<deUint32*>(static_cast<deUint8*>(resultAlloc.getHostPtr()) + sizeof(deInt32));

		// If this fails then we didn't read all vertices from shader and test must be changed to allow more.
		DE_ASSERT(numVertices <= refNumVertices);

		if (numVertices < refNumUniqueVertices)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Failure: got " << numVertices << " vertices, but expected at least " << refNumUniqueVertices << tcu::TestLog::EndMessage;

			return tcu::TestStatus::fail("Wrong number of vertices");
		}
		else
		{
			tcu::TestLog&	log					= m_context.getTestContext().getLog();
			const int		topLevelArraySize	= (m_caseDef.ioType == IO_TYPE_PER_PATCH			? 1
												: m_caseDef.ioType == IO_TYPE_PER_PATCH_ARRAY		? NUM_PER_PATCH_ARRAY_ELEMS
												: m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK		? 1
												: m_caseDef.ioType == IO_TYPE_PER_PATCH_BLOCK_ARRAY	? NUM_PER_PATCH_BLOCKS
												: NUM_OUTPUT_VERTICES);
			const deUint32	numTEInputs			= numBasicSubobjectsInElementType(m_tesInputs) * topLevelArraySize;

			for (int vertexNdx = 0; vertexNdx < numVertices; ++vertexNdx)
				if (vertices[vertexNdx] > numTEInputs)
				{
					log << tcu::TestLog::Message
						<< "Failure: out_te_firstFailedInputIndex has value " << vertices[vertexNdx]
						<< ", but should be in range [0, " << numTEInputs << "]" << tcu::TestLog::EndMessage;

					return tcu::TestStatus::fail("Invalid values returned from shader");
				}
				else if (vertices[vertexNdx] != numTEInputs)
				{
					log << tcu::TestLog::Message << "Failure: in tessellation evaluation shader, check for input "
						<< basicSubobjectAtIndex(vertices[vertexNdx], m_tesInputs, topLevelArraySize) << " failed" << tcu::TestLog::EndMessage;

					return tcu::TestStatus::fail("Invalid input value in tessellation evaluation shader");
				}
		}
	}
	return (isImageCompareOK ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Image comparison failed"));
}